

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadBGFGroupNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  _func_int *p_Var1;
  int iVar2;
  char *__nptr;
  key_type *pkVar3;
  runtime_error *this_00;
  _func_int **pp_Var4;
  long *in_RDX;
  Node *in_RDI;
  size_t id;
  size_t i;
  Ref<embree::SceneGraph::GroupNode> group;
  size_t N;
  Ref<embree::SceneGraph::Node> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  GroupNode *in_stack_fffffffffffffe40;
  size_t in_stack_fffffffffffffe48;
  GroupNode *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe70;
  XML *in_stack_fffffffffffffe78;
  Token *in_stack_fffffffffffffe80;
  key_type *local_138;
  _func_int **local_130;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 uVar5;
  string local_100 [55];
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [32];
  key_type *local_88;
  long *local_80;
  long *local_68;
  long *local_60;
  long *local_58;
  _func_int **local_48;
  _func_int ***local_40;
  _func_int ***local_38;
  _func_int ***local_30;
  _func_int ***local_20;
  _func_int **local_10;
  
  local_80 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"numChildren",&local_c9);
  XML::parm(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  __nptr = (char *)std::__cxx11::string::c_str();
  iVar2 = atoi(__nptr);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  local_58 = local_80;
  local_88 = (key_type *)(long)iVar2;
  pkVar3 = (key_type *)
           std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                     ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_80 + 0x98));
  if (pkVar3 != local_88) {
    uVar5 = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_60 = local_80;
    ParseLocation::str_abi_cxx11_((ParseLocation *)CONCAT17(uVar5,in_stack_fffffffffffffed8));
    std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
    std::runtime_error::runtime_error(this_00,local_100);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pp_Var4 = (_func_int **)::operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  local_40 = &local_130;
  local_48 = pp_Var4;
  if (pp_Var4 != (_func_int **)0x0) {
    p_Var1 = *local_130;
    local_130 = pp_Var4;
    (**(code **)(p_Var1 + 0x10))();
    pp_Var4 = local_130;
  }
  local_130 = pp_Var4;
  for (local_138 = (key_type *)0x0; local_138 < local_88;
      local_138 = (key_type *)((long)local_138 + 1)) {
    local_68 = local_80;
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_80 + 0x98),
               (size_type)local_138);
    Token::Int(in_stack_fffffffffffffe80);
    local_38 = &local_130;
    in_stack_fffffffffffffe50 =
         (GroupNode *)
         std::
         map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
         ::at((map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               *)in_stack_fffffffffffffe50,local_138);
    SceneGraph::GroupNode::set
              (in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30
              );
  }
  local_20 = &local_130;
  local_10 = local_130;
  (in_RDI->super_RefCount)._vptr_RefCount = local_130;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_30 = &local_130;
  if (local_130 != (_func_int **)0x0) {
    (**(code **)(*local_130 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadBGFGroupNode(const Ref<XML>& xml) 
  {
    const size_t N  = atoi(xml->parm("numChildren").c_str());
    if (xml->body.size() != N) 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid group node");

    Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode(N);
    for (size_t i=0; i<N; i++) 
    {
      const size_t id = xml->body[i].Int();
      group->set(i,id2node.at(id));
    }
    return group.cast<SceneGraph::Node>();
  }